

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::SpirVAssembly::createOpConstantNullTests(TestContext *testCtx)

{
  mapped_type *pmVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  byte bVar10;
  key_type local_458;
  TestCaseGroup *local_438;
  NameConstantsCode *local_430;
  vector<int,_std::allocator<int>_> local_428;
  long lStack_410;
  key_type local_400;
  long *local_3e0 [2];
  long local_3d0 [2];
  long local_3c0;
  RGBA colors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  NameConstantsCode tests [7];
  char functionEnd [48];
  char functionStart [108];
  
  bVar10 = 0;
  local_438 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_438,testCtx,"opconstantnull","OpConstantNull instruction")
  ;
  colors[0].m_value = 0;
  colors[1].m_value = 0;
  colors[2].m_value = 0;
  colors[3].m_value = 0;
  pcVar7 = 
  "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1 = OpFunctionParameter %v4f32\n%lbl    = OpLabel\n"
  ;
  pcVar8 = functionStart;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + ((ulong)bVar10 * -2 + 1) * 8;
    pcVar8 = pcVar8 + (ulong)bVar10 * -0x10 + 8;
  }
  builtin_strncpy(functionStart + 0x68,"el\n",4);
  tests[0].name._M_dataplus._M_p = (pointer)&tests[0].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)tests,"vec4","");
  tests[0].constants._M_dataplus._M_p = (pointer)&tests[0].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[0].constants,"%cnull = OpConstantNull %v4f32\n","");
  tests[0].code._M_dataplus._M_p = (pointer)&tests[0].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[0].code,"%transformed_param = OpFAdd %v4f32 %param1 %cnull\n","");
  tests[1].name._M_dataplus._M_p = (pointer)&tests[1].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 1),"float","");
  tests[1].constants._M_dataplus._M_p = (pointer)&tests[1].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[1].constants,"%cnull = OpConstantNull %f32\n","");
  tests[1].code._M_dataplus._M_p = (pointer)&tests[1].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[1].code,
             "%vp = OpVariable %fp_v4f32 Function\n%v  = OpLoad %v4f32 %vp\n%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
             ,"");
  tests[2].name._M_dataplus._M_p = (pointer)&tests[2].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 2),"bool","");
  tests[2].constants._M_dataplus._M_p = (pointer)&tests[2].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[2].constants,"%cnull             = OpConstantNull %bool\n","");
  tests[2].code._M_dataplus._M_p = (pointer)&tests[2].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[2].code,
             "%v                 = OpVariable %fp_v4f32 Function\n                     OpStore %v %param1\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %cnull %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,"");
  tests[3].name._M_dataplus._M_p = (pointer)&tests[3].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 3),"i32","");
  tests[3].constants._M_dataplus._M_p = (pointer)&tests[3].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].constants,"%cnull             = OpConstantNull %i32\n","");
  tests[3].code._M_dataplus._M_p = (pointer)&tests[3].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].code,
             "%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n%b                 = OpIEqual %bool %cnull %c_i32_0\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %b %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %param1\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,"");
  tests[4].name._M_dataplus._M_p = (pointer)&tests[4].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 4),"struct","");
  tests[4].constants._M_dataplus._M_p = (pointer)&tests[4].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].constants,
             "%stype             = OpTypeStruct %f32 %v4f32\n%fp_stype          = OpTypePointer Function %stype\n%cnull             = OpConstantNull %stype\n"
             ,"");
  tests[4].code._M_dataplus._M_p = (pointer)&tests[4].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].code,
             "%v                 = OpVariable %fp_stype Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n%f_val             = OpLoad %v4f32 %f\n%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
             ,"");
  tests[5].name._M_dataplus._M_p = (pointer)&tests[5].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 5),"array","");
  tests[5].constants._M_dataplus._M_p = (pointer)&tests[5].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[5].constants,
             "%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n%cnull             = OpConstantNull %a4_v4f32\n"
             ,"");
  tests[5].code._M_dataplus._M_p = (pointer)&tests[5].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[5].code,
             "%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n%f_val             = OpLoad %v4f32 %f\n%f1_val            = OpLoad %v4f32 %f1\n%f2_val            = OpLoad %v4f32 %f2\n%f3_val            = OpLoad %v4f32 %f3\n%t0                = OpFAdd %v4f32 %param1 %f_val\n%t1                = OpFAdd %v4f32 %t0 %f1_val\n%t2                = OpFAdd %v4f32 %t1 %f2_val\n%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
             ,"");
  tests[6].name._M_dataplus._M_p = (pointer)&tests[6].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 6),"matrix","");
  tests[6].constants._M_dataplus._M_p = (pointer)&tests[6].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[6].constants,
             "%mat4x4_f32        = OpTypeMatrix %v4f32 4\n%cnull             = OpConstantNull %mat4x4_f32\n"
             ,"");
  paVar9 = &tests[6].code.field_2;
  tests[6].code._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[6].code,
             "%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n%transformed_param = OpFAdd %v4f32 %param1 %v\n"
             ,"");
  local_430 = tests;
  getHalfColorsFullAlpha(&colors);
  lVar4 = 7;
  do {
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3c0 = lVar4;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"pre_main","");
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_458);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    local_3e0[0] = local_3d0;
    sVar2 = strlen(functionStart);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3e0,functionStart,functionStart + sVar2);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_3e0,(ulong)(local_430->code)._M_dataplus._M_p);
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    plVar5 = plVar3 + 2;
    if ((pointer *)*plVar3 == (pointer *)plVar5) {
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar5;
      lStack_410 = plVar3[3];
    }
    else {
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar5;
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar3;
    }
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_428);
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_458.field_2._M_allocated_capacity = *puVar6;
      local_458.field_2._8_4_ = (undefined4)plVar3[3];
      local_458.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    }
    else {
      local_458.field_2._M_allocated_capacity = *puVar6;
      local_458._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_458._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"testfun","");
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_400);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_3e0[0] != local_3d0) {
      operator_delete(local_3e0[0],local_3d0[0] + 1);
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    local_458._M_string_length = 0;
    local_458.field_2._M_allocated_capacity =
         local_458.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    createTestsForAllStages
              (&local_430->name,&colors,&colors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments._M_t,&local_428,local_438,QP_TEST_RESULT_FAIL,&local_458);
    if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar4 = local_3c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    local_430 = local_430 + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = -0x2a0;
  do {
    plVar3 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
    if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
      operator_delete(plVar3,paVar9->_M_allocated_capacity + 1);
    }
    if (paVar9 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar9[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar9[-3]._M_allocated_capacity,paVar9[-2]._M_allocated_capacity + 1)
      ;
    }
    if (paVar9 + -4 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar9[-5]._M_allocated_capacity) {
      operator_delete((long *)paVar9[-5]._M_allocated_capacity,paVar9[-4]._M_allocated_capacity + 1)
      ;
    }
    paVar9 = paVar9 + -6;
    lVar4 = lVar4 + 0x60;
  } while (lVar4 != 0);
  return local_438;
}

Assistant:

tcu::TestCaseGroup* createOpConstantNullTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantNullTests		(new tcu::TestCaseGroup(testCtx, "opconstantnull", "OpConstantNull instruction"));
	RGBA							colors[4];


	const char						functionStart[] =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]	=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",
			"%cnull = OpConstantNull %v4f32\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cnull\n"
		},
		{
			"float",
			"%cnull = OpConstantNull %f32\n",
			"%vp = OpVariable %fp_v4f32 Function\n"
			"%v  = OpLoad %v4f32 %vp\n"
			"%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n"
			"%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n"
			"%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n"
			"%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
		},
		{
			"bool",
			"%cnull             = OpConstantNull %bool\n",
			"%v                 = OpVariable %fp_v4f32 Function\n"
			"                     OpStore %v %param1\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %cnull %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"i32",
			"%cnull             = OpConstantNull %i32\n",
			"%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n"
			"%b                 = OpIEqual %bool %cnull %c_i32_0\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %b %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %param1\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"struct",
			"%stype             = OpTypeStruct %f32 %v4f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%cnull             = OpConstantNull %stype\n",
			"%v                 = OpVariable %fp_stype Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
		},
		{
			"array",
			"%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n"
			"%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n"
			"%cnull             = OpConstantNull %a4_v4f32\n",
			"%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n"
			"%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n"
			"%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%f1_val            = OpLoad %v4f32 %f1\n"
			"%f2_val            = OpLoad %v4f32 %f2\n"
			"%f3_val            = OpLoad %v4f32 %f3\n"
			"%t0                = OpFAdd %v4f32 %param1 %f_val\n"
			"%t1                = OpFAdd %v4f32 %t0 %f1_val\n"
			"%t2                = OpFAdd %v4f32 %t1 %f2_val\n"
			"%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
		},
		{
			"matrix",
			"%mat4x4_f32        = OpTypeMatrix %v4f32 4\n"
			"%cnull             = OpConstantNull %mat4x4_f32\n",
			// Our null matrix * any vector should result in a zero vector.
			"%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v\n"
		}
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, opConstantNullTests.get());
	}
	return opConstantNullTests.release();
}